

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void pnga_elem_maximum(Integer g_a,Integer g_b,Integer g_c)

{
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  long lVar4;
  Integer cndim;
  Integer bndim;
  Integer andim;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer clo [7];
  Integer bhi [7];
  Integer blo [7];
  Integer ahi [7];
  Integer alo [7];
  Integer chi [7];
  
  pnga_inquire(g_a,&atype,&andim,ahi);
  pnga_inquire(g_b,&btype,&bndim,bhi);
  pnga_inquire(g_c,&ctype,&cndim,chi);
  if ((andim != bndim) || (IVar2 = andim, IVar3 = andim, andim != cndim)) {
    pnga_error("global arrays have different dimmensions.",andim);
    IVar2 = bndim;
    IVar3 = cndim;
  }
  IVar1 = andim;
  for (lVar4 = 0; IVar1 + lVar4 != 0; lVar4 = lVar4 + -1) {
    andim = IVar1 + lVar4 + -1;
    alo[IVar1 + lVar4 + -1] = 1;
    bndim = IVar2 + -1 + lVar4;
    blo[IVar2 + lVar4 + -1] = 1;
    cndim = IVar3 + -1 + lVar4;
    clo[IVar3 + lVar4 + -1] = 1;
  }
  _ga_sync_begin = 1;
  ngai_elem2_patch_(g_a,alo,ahi,g_b,blo,bhi,g_c,clo,chi,5);
  return;
}

Assistant:

void pnga_elem_maximum(Integer g_a, Integer g_b, Integer g_c){

   Integer atype, andim;
   Integer btype, bndim;
   Integer ctype, cndim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer blo[MAXDIM],bhi[MAXDIM];
   Integer clo[MAXDIM],chi[MAXDIM];

    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    pnga_inquire(g_c,  &ctype, &cndim, chi);
    if((andim!=bndim)||(andim!=cndim))
        pnga_error("global arrays have different dimmensions.", andim);
    while(andim){
        alo[andim-1]=1;
        blo[bndim-1]=1;
        clo[cndim-1]=1;
        andim--;
        bndim--;
        cndim--;
    }

    _ga_sync_begin = 1; /*just to be on the safe side*/
    ngai_elem2_patch_(g_a, alo, ahi, g_b, blo, bhi,g_c,clo,chi,OP_ELEM_MAX);

}